

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_matrix.cpp
# Opt level: O1

void __thiscall VSMatrix::multMatrix(VSMatrix *this,FLOATTYPE *aMatrix)

{
  long lVar1;
  int i;
  long lVar2;
  FLOATTYPE *pFVar3;
  FLOATTYPE *pFVar4;
  int j;
  long lVar5;
  long lVar6;
  float fVar7;
  FLOATTYPE res [16];
  
  lVar2 = 0;
  pFVar3 = this->mMatrix;
  do {
    lVar5 = 0;
    pFVar4 = aMatrix;
    do {
      lVar1 = lVar2 + lVar5 * 4;
      res[lVar1] = 0.0;
      fVar7 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)pFVar4 + lVar6) * pFVar3[lVar6];
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      res[lVar1] = fVar7;
      lVar5 = lVar5 + 1;
      pFVar4 = pFVar4 + 4;
    } while (lVar5 != 4);
    lVar2 = lVar2 + 1;
    pFVar3 = pFVar3 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(this->mMatrix + 0xc) = res._48_8_;
  *(undefined8 *)(this->mMatrix + 0xe) = res._56_8_;
  *(undefined8 *)(this->mMatrix + 8) = res._32_8_;
  *(undefined8 *)(this->mMatrix + 10) = res._40_8_;
  *(undefined8 *)(this->mMatrix + 4) = res._16_8_;
  *(undefined8 *)(this->mMatrix + 6) = res._24_8_;
  *(undefined8 *)this->mMatrix = res._0_8_;
  *(undefined8 *)(this->mMatrix + 2) = res._8_8_;
  return;
}

Assistant:

void 
VSMatrix::multMatrix(const FLOATTYPE *aMatrix)
{
	
	FLOATTYPE res[16];

	for (int i = 0; i < 4; ++i) 
	{
		for (int j = 0; j < 4; ++j) 
		{
			res[j*4 + i] = 0.0f;
			for (int k = 0; k < 4; ++k) 
			{
				res[j*4 + i] += mMatrix[k*4 + i] * aMatrix[j*4 + k]; 
			}
		}
	}
	memcpy(mMatrix, res, 16 * sizeof(FLOATTYPE));
}